

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::tracker_logger::tracker_response
          (tracker_logger *this,tracker_request *param_1,address *tracker_ip,
          list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *tracker_ips,
          tracker_response *resp)

{
  ushort uVar1;
  tracker_response *this_00;
  bool bVar2;
  uint uVar3;
  undefined8 uVar4;
  vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
  *this_01;
  vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
  *this_02;
  ulong uVar5;
  address *addr;
  address *addr_00;
  address *addr_01;
  undefined1 auVar6 [16];
  span<const_char> in;
  char *local_1f0;
  address_v6 local_1b8;
  address local_1a0;
  string local_180;
  reference local_160;
  ipv6_peer_entry *p_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
  *__range2_2;
  address local_138;
  string local_118;
  reference local_f8;
  ipv4_peer_entry *p_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
  *__range2_1;
  aux *local_d0;
  char *local_c8;
  string local_c0;
  reference local_a0;
  peer_entry *p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_> *__range2;
  string local_70;
  string local_50;
  tracker_response *local_30;
  tracker_response *resp_local;
  list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *tracker_ips_local;
  address *tracker_ip_local;
  tracker_request *param_1_local;
  tracker_logger *this_local;
  
  local_30 = resp;
  resp_local = (tracker_response *)tracker_ips;
  tracker_ips_local =
       (list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)tracker_ip;
  tracker_ip_local = (address *)param_1;
  param_1_local = (tracker_request *)this;
  uVar3 = ::std::chrono::duration<int,_std::ratio<1L,_1L>_>::count(&resp->interval);
  print_address_abi_cxx11_(&local_50,(aux *)&local_30->external_ip,addr);
  auVar6 = ::std::__cxx11::string::c_str();
  uVar5 = auVar6._0_8_;
  print_address_abi_cxx11_(&local_70,(aux *)tracker_ips_local,auVar6._8_8_);
  uVar4 = ::std::__cxx11::string::c_str();
  (*(this->super_request_callback)._vptr_request_callback[7])
            (this,"TRACKER RESPONSE\ninterval: %d\nexternal ip: %s\nwe connected to: %s\npeers:",
             (ulong)uVar3,uVar5,uVar4);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  this_00 = local_30;
  __end2 = ::std::vector<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>
           ::begin(&local_30->peers);
  p = (peer_entry *)
      ::std::vector<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>::end
                (&this_00->peers);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_libtorrent::aux::peer_entry_*,_std::vector<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>_>
                                     *)&p), bVar2) {
    local_a0 = __gnu_cxx::
               __normal_iterator<const_libtorrent::aux::peer_entry_*,_std::vector<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>_>
               ::operator*(&__end2);
    uVar4 = ::std::__cxx11::string::c_str();
    uVar1 = local_a0->port;
    bVar2 = digest32<160L>::is_all_zeros(&local_a0->pid);
    if (bVar2) {
      local_1f0 = "";
    }
    else {
      span<char_const>::span<libtorrent::digest32<160l>,char,void>
                ((span<char_const> *)&local_d0,&local_a0->pid);
      in.m_len = uVar5;
      in.m_ptr = local_c8;
      to_hex_abi_cxx11_(&local_c0,local_d0,in);
      local_1f0 = (char *)::std::__cxx11::string::c_str();
    }
    __range2_1._7_1_ = !bVar2;
    uVar5 = (ulong)uVar1;
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"  %16s %5d %s",uVar4,uVar5,local_1f0);
    if (__range2_1._7_1_) {
      ::std::__cxx11::string::~string((string *)&local_c0);
    }
    __gnu_cxx::
    __normal_iterator<const_libtorrent::aux::peer_entry_*,_std::vector<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>_>
    ::operator++(&__end2);
  }
  this_01 = &local_30->peers4;
  __end2_1 = ::std::
             vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
             ::begin(this_01);
  p_1 = (ipv4_peer_entry *)
        ::std::
        vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
        ::end(this_01);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<const_libtorrent::aux::ipv4_peer_entry_*,_std::vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>_>
                             *)&p_1), bVar2) {
    local_f8 = __gnu_cxx::
               __normal_iterator<const_libtorrent::aux::ipv4_peer_entry_*,_std::vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>_>
               ::operator*(&__end2_1);
    boost::asio::ip::address_v4::address_v4((address_v4 *)((long)&__range2_2 + 4),&local_f8->ip);
    boost::asio::ip::address::address(&local_138,(address_v4 *)((long)&__range2_2 + 4));
    print_address_abi_cxx11_(&local_118,(aux *)&local_138,addr_00);
    uVar4 = ::std::__cxx11::string::c_str();
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"  %s:%d",uVar4,(ulong)local_f8->port);
    ::std::__cxx11::string::~string((string *)&local_118);
    __gnu_cxx::
    __normal_iterator<const_libtorrent::aux::ipv4_peer_entry_*,_std::vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>_>
    ::operator++(&__end2_1);
  }
  this_02 = &local_30->peers6;
  __end2_2 = ::std::
             vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
             ::begin(this_02);
  p_2 = (ipv6_peer_entry *)
        ::std::
        vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
        ::end(this_02);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2_2,
                            (__normal_iterator<const_libtorrent::aux::ipv6_peer_entry_*,_std::vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>_>
                             *)&p_2), bVar2) {
    local_160 = __gnu_cxx::
                __normal_iterator<const_libtorrent::aux::ipv6_peer_entry_*,_std::vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>_>
                ::operator*(&__end2_2);
    boost::asio::ip::address_v6::address_v6(&local_1b8,&local_160->ip,0);
    boost::asio::ip::address::address(&local_1a0,&local_1b8);
    print_address_abi_cxx11_(&local_180,(aux *)&local_1a0,addr_01);
    uVar4 = ::std::__cxx11::string::c_str();
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"  [%s]:%d",uVar4,(ulong)local_160->port);
    ::std::__cxx11::string::~string((string *)&local_180);
    __gnu_cxx::
    __normal_iterator<const_libtorrent::aux::ipv6_peer_entry_*,_std::vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>_>
    ::operator++(&__end2_2);
  }
  return;
}

Assistant:

void tracker_logger::tracker_response(tracker_request const&
			, libtorrent::address const& tracker_ip
			, std::list<address> const& tracker_ips
			, struct tracker_response const& resp)
		{
			TORRENT_UNUSED(tracker_ips);
			debug_log("TRACKER RESPONSE\n"
				"interval: %d\n"
				"external ip: %s\n"
				"we connected to: %s\n"
				"peers:"
				, resp.interval.count()
				, print_address(resp.external_ip).c_str()
				, print_address(tracker_ip).c_str());

			for (auto const& p : resp.peers)
			{
				debug_log("  %16s %5d %s", p.hostname.c_str(), p.port
					, p.pid.is_all_zeros() ? "" : to_hex(p.pid).c_str());
			}
			for (auto const& p : resp.peers4)
			{
				debug_log("  %s:%d", print_address(address_v4(p.ip)).c_str(), p.port);
			}
			for (auto const& p : resp.peers6)
			{
				debug_log("  [%s]:%d", print_address(address_v6(p.ip)).c_str(), p.port);
			}
		}